

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O0

void Amap_ManCutSaveStored(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  Amap_Cut_t **ppAVar5;
  int local_4c;
  int local_48;
  int nCuts2;
  int nCuts;
  int Entry;
  int nWords;
  int i;
  Amap_Cut_t *pCut;
  Amap_Cut_t *pNext;
  int *pBuffer;
  int nMaxCuts;
  Amap_Obj_t *pNode_local;
  Amap_Man_t *p_local;
  
  iVar1 = p->pPars->nCutsMax;
  if ((pNode->field_11).pData != (void *)0x0) {
    __assert_fail("pNode->pData == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                  ,0xb4,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
  }
  local_48 = 1;
  nCuts = 2;
  for (Entry = 0; iVar2 = Vec_IntSize(p->vTemp), Entry < iVar2; Entry = Entry + 1) {
    iVar2 = Vec_IntEntry(p->vTemp,Entry);
    _nWords = p->ppCutsTemp[iVar2];
    while (_nWords != (Amap_Cut_t *)0x0) {
      local_48 = local_48 + 1;
      if (local_48 < iVar1) {
        nCuts = ((uint)*_nWords >> 0x11) + 1 + nCuts;
      }
      ppAVar5 = Amap_ManCutNextP(_nWords);
      _nWords = *ppAVar5;
    }
  }
  p->nBytesUsed = nCuts * 4 + p->nBytesUsed;
  puVar4 = (uint *)Aig_MmFlexEntryFetch(p->pMemCuts,nCuts << 2);
  *puVar4 = *puVar4 & 0xffff0000;
  *puVar4 = *puVar4 & 0xfffeffff;
  *puVar4 = *puVar4 & 0x1ffff | 0x20000;
  uVar3 = Abc_Var2Lit((uint)(*(ulong *)pNode >> 3) & 0x1fffffff,0);
  puVar4[1] = uVar3;
  pCut = (Amap_Cut_t *)(puVar4 + 2);
  local_4c = 1;
  for (Entry = 0; iVar2 = Vec_IntSize(p->vTemp), Entry < iVar2; Entry = Entry + 1) {
    iVar2 = Vec_IntEntry(p->vTemp,Entry);
    _nWords = p->ppCutsTemp[iVar2];
    while (_nWords != (Amap_Cut_t *)0x0) {
      local_4c = local_4c + 1;
      if (local_4c < iVar1) {
        memcpy(pCut,_nWords,(long)(int)(((uint)*_nWords >> 0x11) + 1) << 2);
        pCut = pCut + (long)(int)((uint)*_nWords >> 0x11) + 1;
      }
      ppAVar5 = Amap_ManCutNextP(_nWords);
      _nWords = *ppAVar5;
    }
    p->ppCutsTemp[iVar2] = (Amap_Cut_t *)0x0;
  }
  if (local_48 != local_4c) {
    __assert_fail("nCuts == nCuts2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                  ,0xda,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
  }
  if ((long)pCut - (long)puVar4 >> 2 != (long)nCuts) {
    __assert_fail("(int *)pNext - pBuffer == nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                  ,0xdb,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
  }
  Vec_IntClear(p->vTemp);
  Aig_MmFlexRestart(p->pMemTemp);
  for (Entry = 0; iVar2 = p->pLib->nNodes, SBORROW4(Entry,iVar2 * 2) != Entry + iVar2 * -2 < 0;
      Entry = Entry + 1) {
    if (p->ppCutsTemp[Entry] != (Amap_Cut_t *)0x0) {
      printf("Amap_ManCutSaveStored(): Error!\n");
    }
  }
  (pNode->field_11).pData = puVar4;
  uVar3 = Abc_MinInt(local_48,iVar1 + -1);
  pNode->nCuts = uVar3;
  if (local_48 < 0x100000) {
    _nWords = (Amap_Cut_t *)0x0;
    Entry = 0;
    pCut = (Amap_Cut_t *)(pNode->field_11).pData;
    while( true ) {
      if (((int)pNode->nCuts <= Entry) || (Entry == iVar1)) {
        return;
      }
      if ((_nWords != (Amap_Cut_t *)0x0) && (((uint)*pCut & 0xffff) < ((uint)*_nWords & 0xffff)))
      break;
      _nWords = pCut;
      Entry = Entry + 1;
      pCut = Amap_ManCutNext(pCut);
    }
    __assert_fail("pCut == NULL || pCut->iMat <= pNext->iMat",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                  ,0xee,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
  }
  __assert_fail("nCuts < (1<<20)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/amap/amapMerge.c"
                ,0xe4,"void Amap_ManCutSaveStored(Amap_Man_t *, Amap_Obj_t *)");
}

Assistant:

void Amap_ManCutSaveStored( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    int nMaxCuts = p->pPars->nCutsMax;
    int * pBuffer;
    Amap_Cut_t * pNext, * pCut;
    int i, nWords, Entry, nCuts, nCuts2;
    assert( pNode->pData == NULL );
    // count memory needed
    nCuts = 1;
    nWords = 2;
    Vec_IntForEachEntry( p->vTemp, Entry, i )
    {
        for ( pCut = p->ppCutsTemp[Entry]; pCut; pCut = *Amap_ManCutNextP(pCut) )
        {
            nCuts++;
            if ( nCuts < nMaxCuts )
                nWords += pCut->nFans + 1;
        }
    }
    p->nBytesUsed += 4*nWords;
    // allocate memory
    pBuffer = (int *)Aig_MmFlexEntryFetch( p->pMemCuts, 4*nWords );
    pNext = (Amap_Cut_t *)pBuffer;
    // add the first cut
    pNext->iMat  = 0; 
    pNext->fInv  = 0;
    pNext->nFans = 1;
    pNext->Fans[0] = Abc_Var2Lit(pNode->Id, 0);
    pNext  = (Amap_Cut_t *)(pBuffer + 2);
    // add other cuts
    nCuts2 = 1;
    Vec_IntForEachEntry( p->vTemp, Entry, i )
    {
        for ( pCut = p->ppCutsTemp[Entry]; pCut; pCut = *Amap_ManCutNextP(pCut) )
        {
            nCuts2++;
            if ( nCuts2 < nMaxCuts )
            {
                memcpy( pNext, pCut, sizeof(int) * (pCut->nFans + 1) );
                pNext = (Amap_Cut_t *)((int *)pNext + pCut->nFans + 1);
            }
        }
        p->ppCutsTemp[Entry] = NULL;
    }
    assert( nCuts == nCuts2 );
    assert( (int *)pNext - pBuffer == nWords );
    // restore the storage
    Vec_IntClear( p->vTemp );
    Aig_MmFlexRestart( p->pMemTemp );
    for ( i = 0; i < 2*p->pLib->nNodes; i++ )
        if ( p->ppCutsTemp[i] != NULL )
            printf( "Amap_ManCutSaveStored(): Error!\n" );
    pNode->pData = (Amap_Cut_t *)pBuffer;
    pNode->nCuts = Abc_MinInt( nCuts, nMaxCuts-1 );
    assert( nCuts < (1<<20) );
//    printf("%d ", nCuts );
    // verify cuts
    pCut = NULL;
    Amap_NodeForEachCut( pNode, pNext, i )
//        for ( i = 0, pNext = (Amap_Cut_t *)pNode->pData; i < (int)pNode->nCuts; 
//        i++, pNext = Amap_ManCutNext(pNext) )
    {
        if ( i == nMaxCuts )
            break;
        assert( pCut == NULL || pCut->iMat <= pNext->iMat );
        pCut = pNext;
    }
}